

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O2

ostream * operator<<(ostream *out,BLH blh)

{
  ostream *poVar1;
  
  std::operator<<(out,"(");
  poVar1 = std::ostream::_M_insert<double>(blh.B);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(blh.L);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(blh.H);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  return out;
}

Assistant:

ostream & operator<<(ostream &out, const BLH blh)
{
    out << "(" << blh.B << ", " << blh.L << ", " << blh.H << ")" << endl;
    return out;
}